

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O0

bool __thiscall
QWidgetTextControl::setFocusToAnchor(QWidgetTextControl *this,QTextCursor *newCursor)

{
  bool bVar1;
  MoveMode MVar2;
  QWidgetTextControlPrivate *pQVar3;
  QWidgetTextControlPrivate *in_RDI;
  long in_FS_OFFSET;
  QWidgetTextControlPrivate *d;
  QRectF crect;
  QString anchorHref;
  undefined4 in_stack_ffffffffffffff48;
  TextInteractionFlag in_stack_ffffffffffffff4c;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  QTextCursor *in_stack_ffffffffffffff60;
  QTextCursor *this_00;
  bool local_69;
  QFlagsStorageHelper<Qt::TextInteractionFlag,_4> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QWidgetTextControl *)0x71f9e5);
  local_c.super_QFlagsStorage<Qt::TextInteractionFlag>.i =
       (QFlagsStorage<Qt::TextInteractionFlag>)
       QFlags<Qt::TextInteractionFlag>::operator&
                 ((QFlags<Qt::TextInteractionFlag> *)
                  CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                  in_stack_ffffffffffffff4c);
  bVar1 = QFlags<Qt::TextInteractionFlag>::operator!((QFlags<Qt::TextInteractionFlag> *)&local_c);
  if (bVar1) {
    local_69 = false;
  }
  else {
    QWidgetTextControlPrivate::anchorForCursor(in_RDI,in_stack_ffffffffffffff60);
    local_69 = QString::isEmpty((QString *)0x71fa75);
    if (!local_69) {
      selectionRect((QWidgetTextControl *)in_stack_ffffffffffffff60);
      updateRequest((QWidgetTextControl *)
                    CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                    (QRectF *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      MVar2 = QTextCursor::selectionStart();
      QTextCursor::setPosition((int)pQVar3 + 0x88,MVar2);
      this_00 = &pQVar3->cursor;
      MVar2 = QTextCursor::selectionEnd();
      QTextCursor::setPosition((int)this_00,MVar2);
      pQVar3->cursorIsFocusIndicator = true;
      selectionRect((QWidgetTextControl *)this_00);
      updateRequest((QWidgetTextControl *)
                    CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                    (QRectF *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      visibilityRequest((QWidgetTextControl *)
                        CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                        (QRectF *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    }
    local_69 = !local_69;
    QString::~QString((QString *)0x71fbb5);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_69;
}

Assistant:

bool QWidgetTextControl::setFocusToAnchor(const QTextCursor &newCursor)
{
    Q_D(QWidgetTextControl);

    if (!(d->interactionFlags & Qt::LinksAccessibleByKeyboard))
        return false;

    // Verify that this is an anchor.
    const QString anchorHref = d->anchorForCursor(newCursor);
    if (anchorHref.isEmpty())
        return false;

    // and process it
    QRectF crect = selectionRect();
    emit updateRequest(crect);

    d->cursor.setPosition(newCursor.selectionStart());
    d->cursor.setPosition(newCursor.selectionEnd(), QTextCursor::KeepAnchor);
    d->cursorIsFocusIndicator = true;

    crect = selectionRect();
    emit updateRequest(crect);
    emit visibilityRequest(crect);
    return true;
}